

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O2

void __thiscall
iDynTree::SpatialInertia::fromRotationalInertiaWrtCenterOfMass
          (SpatialInertia *this,double mass,Position *com,RotationalInertia *rotInertiaWrtCom)

{
  long lVar1;
  Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> comInertia;
  Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> linkInertia;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> mcom;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_b0 [24];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
  local_98;
  Matrix<double,_3,_3,_0,_3,_3> local_60;
  
  this->m_mass = mass;
  mcom.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = this->m_mcom;
  for (lVar1 = 1; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->m_mcom[lVar1 + -1] = (com->super_Vector3).m_data[lVar1 + -1] * mass;
  }
  linkInertia._0_8_ = &this->m_rotInertia;
  comInertia.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)rotInertiaWrtCom;
  if (mass == 0.0) {
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>>
              (&linkInertia,&comInertia);
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              (local_b0,(DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                         *)&mcom);
    squareCrossProductMatrix((Vector3d *)local_b0);
    local_98.m_rhs.m_rhs.m_functor.m_other = this->m_mass;
    local_98.m_lhs.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
    ._8_2_ = comInertia.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
             ._8_2_;
    local_98.m_lhs.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = comInertia.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    local_98.m_rhs.m_lhs = &local_60;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const>>
              (&linkInertia,&local_98);
  }
  return;
}

Assistant:

void SpatialInertia::fromRotationalInertiaWrtCenterOfMass(const double mass,
                                                        const Position& com,
                                                        const RotationalInertia& rotInertiaWrtCom)
{
    this->m_mass = mass;

    for(int i = 0; i < 3; i++ )
    {
        this->m_mcom[i] = this->m_mass*com(i);
    }

    // Here we need to compute the rotational inertia at the com
    // given the one expressed at the frame origin
    // we apply formula 2.63 in Featherstone 2008
    Eigen::Map<Eigen::Matrix3d> linkInertia(this->m_rotInertia.data());
    Eigen::Map<const Eigen::Matrix3d> comInertia(rotInertiaWrtCom.data());
    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);

    if( fabs(this->m_mass) > 0)
    {
        linkInertia = comInertia - squareCrossProductMatrix(mcom)/this->m_mass;
    }
    else
    {
        linkInertia = comInertia;
    }
}